

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::writeFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  allocator<char> local_51;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string fileData;
  
  requireDStackDepth(this,3,"WRITE-FILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&fileData,"WRITE-FILE",&local_51);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar1,(errorCodes)&fileData);
  std::__cxx11::string::~string((string *)&fileData);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  fileData._M_dataplus._M_p = (pointer)&fileData.field_2;
  fileData._M_string_length = 0;
  fileData.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&fileData,src,(ulong)uVar1);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  std::ostream::write((char *)(f.
                               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x10),(long)fileData._M_dataplus._M_p);
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)(f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                                *(long *)(*(long *)f.
                                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffb5);
  std::__cxx11::string::~string((string *)&fileData);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void writeFile() {
	REQUIRE_DSTACK_DEPTH(3, "WRITE-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "WRITE-FILE", errorWriteFile);
	auto length = SIZE_T(dStack.getTop()); pop();
	auto caddr = dStack.getTop();
	std::string fileData{};
	moveFromDataSpace(fileData, caddr, length);
	f->clear();
	f->write(fileData.c_str(), static_cast<std::streamsize>(length));
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorWriteFile) : 0);
}